

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_shr_slow(JSContext *ctx,JSValue *sp)

{
  JSValue val;
  JSValue v;
  int iVar1;
  undefined8 in_RAX;
  double dVar2;
  uint uVar3;
  int64_t iVar4;
  uint32_t v2;
  uint32_t v1;
  
  v = sp[-1];
  val = sp[-1];
  _v2 = in_RAX;
  iVar1 = JS_ToInt32Free(ctx,(int32_t *)&v1,sp[-2]);
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32Free(ctx,(int32_t *)&v2,val);
    if (iVar1 == 0) {
      uVar3 = v1 >> ((byte)v2 & 0x1f);
      dVar2 = (double)uVar3;
      if (-1 < (int)uVar3) {
        dVar2 = (double)(ulong)uVar3;
      }
      iVar4 = 7;
      if (-1 < (int)uVar3) {
        iVar4 = 0;
      }
      sp[-2].u.float64 = dVar2;
      sp[-2].tag = iVar4;
      return 0;
    }
  }
  else {
    JS_FreeValue(ctx,v);
  }
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_shr_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t v1, v2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToUint32Free(ctx, &v1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToUint32Free(ctx, &v2, op2)))
        goto exception;
    r = v1 >> (v2 & 0x1f);
    sp[-2] = JS_NewUint32(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}